

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

uint8 * google::protobuf::internal::InternalSerializeMapEntry
                  (FieldDescriptor *field,MapKey *key,MapValueRef *value,uint8 *target,
                  EpsCopyOutputStream *stream)

{
  FieldDescriptor *field_00;
  long lVar1;
  size_t sVar2;
  EpsCopyOutputStream *this;
  bool bVar3;
  Type TVar4;
  int32 iVar5;
  int iVar6;
  Descriptor *pDVar7;
  size_t sVar8;
  size_t sVar9;
  LogMessage *other;
  string *psVar10;
  int64 iVar11;
  Message *pMVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint8 *puVar13;
  uint32 uVar14;
  uint64 uVar15;
  float fVar16;
  double dVar17;
  uint8 *local_a0;
  MapValueRef *local_98;
  MapKey *local_90;
  LogFinisher local_81;
  FieldDescriptor *local_80;
  EpsCopyOutputStream *local_78;
  uint8 *local_70;
  undefined1 *local_68 [7];
  
  local_78 = stream;
  local_70 = target;
  pDVar7 = FieldDescriptor::message_type(field);
  field_00 = *(FieldDescriptor **)(pDVar7 + 0x28);
  pDVar7 = FieldDescriptor::message_type(field);
  lVar1 = *(long *)(pDVar7 + 0x28);
  local_90 = key;
  sVar8 = MapKeyDataOnlyByteSize(field_00,key);
  local_98 = value;
  local_80 = (FieldDescriptor *)(lVar1 + 0x98);
  sVar9 = MapValueRefDataOnlyByteSize((FieldDescriptor *)(lVar1 + 0x98),value);
  this = local_78;
  io::EpsCopyOutputStream::EnsureSpace(local_78,&local_70);
  local_70 = io::CodedOutputStream::WriteVarint32ToArray(*(int *)(field + 0x44) * 8 + 2,local_70);
  local_a0 = io::CodedOutputStream::WriteVarint32ToArray((int)sVar8 + (int)sVar9 + 2,local_70);
  local_70 = local_a0;
  io::EpsCopyOutputStream::EnsureSpace(this,&local_a0);
  TVar4 = FieldDescriptor::type(field_00);
  switch(TVar4) {
  case TYPE_DOUBLE:
  case TYPE_FLOAT:
  case TYPE_GROUP:
  case TYPE_MESSAGE:
  case TYPE_BYTES:
  case TYPE_ENUM:
    LogMessage::LogMessage
              ((LogMessage *)local_68,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/wire_format.cc"
               ,0x2ba);
    other = LogMessage::operator<<((LogMessage *)local_68,"Unsupported");
    LogFinisher::operator=(&local_81,other);
    LogMessage::~LogMessage((LogMessage *)local_68);
    break;
  case TYPE_INT64:
    uVar15 = MapKey::GetInt64Value(local_90);
    goto LAB_00287e31;
  case TYPE_UINT64:
    uVar15 = MapKey::GetUInt64Value(local_90);
LAB_00287e31:
    *local_a0 = '\b';
LAB_00287e8b:
    local_a0 = io::CodedOutputStream::WriteVarint64ToArray(uVar15,local_a0 + 1);
    break;
  case TYPE_INT32:
    iVar5 = MapKey::GetInt32Value(local_90);
    *local_a0 = '\b';
    local_a0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar5,local_a0 + 1);
    break;
  case TYPE_FIXED64:
    uVar15 = MapKey::GetUInt64Value(local_90);
    goto LAB_00287df6;
  case TYPE_FIXED32:
    uVar14 = MapKey::GetUInt32Value(local_90);
    goto LAB_00287e9c;
  case TYPE_BOOL:
    bVar3 = MapKey::GetBoolValue(local_90);
    *local_a0 = '\b';
    puVar13 = local_a0 + 1;
    uVar14 = (uint32)bVar3;
    goto LAB_00287ecf;
  case TYPE_STRING:
    psVar10 = MapKey::GetStringValue_abi_cxx11_(local_90);
    puVar13 = local_a0;
    sVar2 = psVar10->_M_string_length;
    if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(this->end_ + (0xe - (long)local_a0)))) {
      *local_a0 = '\n';
      local_a0[1] = (uint8)sVar2;
      memcpy(local_a0 + 2,(psVar10->_M_dataplus)._M_p,sVar2);
      local_a0 = puVar13 + sVar2 + 2;
    }
    else {
      local_a0 = io::EpsCopyOutputStream::WriteStringOutline(this,1,psVar10,local_a0);
    }
    break;
  case TYPE_UINT32:
    uVar14 = MapKey::GetUInt32Value(local_90);
    *local_a0 = '\b';
    puVar13 = local_a0 + 1;
    goto LAB_00287ecf;
  case TYPE_SFIXED32:
    uVar14 = MapKey::GetInt32Value(local_90);
LAB_00287e9c:
    *local_a0 = '\r';
    *(uint32 *)(local_a0 + 1) = uVar14;
    local_a0 = local_a0 + 5;
    break;
  case TYPE_SFIXED64:
    uVar15 = MapKey::GetInt64Value(local_90);
LAB_00287df6:
    *local_a0 = '\t';
    *(uint64 *)(local_a0 + 1) = uVar15;
    local_a0 = local_a0 + 9;
    break;
  case TYPE_SINT32:
    iVar5 = MapKey::GetInt32Value(local_90);
    *local_a0 = '\b';
    puVar13 = local_a0 + 1;
    uVar14 = iVar5 * 2 ^ iVar5 >> 0x1f;
LAB_00287ecf:
    local_a0 = io::CodedOutputStream::WriteVarint32ToArray(uVar14,puVar13);
    break;
  case MAX_TYPE:
    iVar11 = MapKey::GetInt64Value(local_90);
    *local_a0 = '\b';
    uVar15 = iVar11 * 2 ^ iVar11 >> 0x3f;
    goto LAB_00287e8b;
  }
  local_70 = local_a0;
  io::EpsCopyOutputStream::EnsureSpace(this,&local_a0);
  TVar4 = FieldDescriptor::type(local_80);
  switch(TVar4) {
  case TYPE_DOUBLE:
    dVar17 = MapValueRef::GetDoubleValue(local_98);
    *local_a0 = '\x11';
    *(double *)(local_a0 + 1) = dVar17;
    goto LAB_002880fe;
  case TYPE_FLOAT:
    fVar16 = MapValueRef::GetFloatValue(local_98);
    *local_a0 = '\x15';
    *(float *)(local_a0 + 1) = fVar16;
    goto LAB_0028815a;
  case TYPE_INT64:
    uVar15 = MapValueRef::GetInt64Value(local_98);
    goto LAB_00288029;
  case TYPE_UINT64:
    uVar15 = MapValueRef::GetUInt64Value(local_98);
LAB_00288029:
    *local_a0 = '\x10';
LAB_002880b3:
    local_a0 = io::CodedOutputStream::WriteVarint64ToArray(uVar15,local_a0 + 1);
    break;
  case TYPE_INT32:
    iVar5 = MapValueRef::GetInt32Value(local_98);
    goto LAB_002880c7;
  case TYPE_FIXED64:
    uVar15 = MapValueRef::GetUInt64Value(local_98);
    goto LAB_002880ef;
  case TYPE_FIXED32:
    uVar14 = MapValueRef::GetUInt32Value(local_98);
    goto LAB_0028814d;
  case TYPE_BOOL:
    bVar3 = MapValueRef::GetBoolValue(local_98);
    *local_a0 = '\x10';
    puVar13 = local_a0 + 1;
    uVar14 = (uint32)bVar3;
    goto LAB_00288051;
  case TYPE_STRING:
  case TYPE_BYTES:
    psVar10 = MapValueRef::GetStringValue_abi_cxx11_(local_98);
    puVar13 = local_a0;
    sVar2 = psVar10->_M_string_length;
    if (((long)sVar2 < 0x80) && ((long)sVar2 <= (long)(this->end_ + (0xe - (long)local_a0)))) {
      *local_a0 = '\x12';
      local_a0[1] = (uint8)sVar2;
      memcpy(local_a0 + 2,(psVar10->_M_dataplus)._M_p,sVar2);
      local_a0 = puVar13 + sVar2 + 2;
    }
    else {
      local_a0 = io::EpsCopyOutputStream::WriteStringOutline(this,2,psVar10,local_a0);
    }
    break;
  case TYPE_GROUP:
    pMVar12 = MapValueRef::GetMessageValue(local_98);
    *local_a0 = '\x13';
    iVar6 = (*(pMVar12->super_MessageLite)._vptr_MessageLite[0xe])(pMVar12,local_a0 + 1,this);
    local_68[0] = (undefined1 *)CONCAT44(extraout_var_00,iVar6);
    io::EpsCopyOutputStream::EnsureSpace(this,local_68);
    *local_68[0] = '\x14';
    local_a0 = local_68[0] + 1;
    break;
  case TYPE_MESSAGE:
    pMVar12 = MapValueRef::GetMessageValue(local_98);
    *local_a0 = '\x12';
    puVar13 = local_a0 + 1;
    uVar14 = (*(pMVar12->super_MessageLite)._vptr_MessageLite[0xc])(pMVar12);
    puVar13 = io::CodedOutputStream::WriteVarint32ToArray(uVar14,puVar13);
    iVar6 = (*(pMVar12->super_MessageLite)._vptr_MessageLite[0xe])(pMVar12,puVar13,this);
    local_a0 = (uint8 *)CONCAT44(extraout_var,iVar6);
    break;
  case TYPE_UINT32:
    uVar14 = MapValueRef::GetUInt32Value(local_98);
    *local_a0 = '\x10';
    puVar13 = local_a0 + 1;
    goto LAB_00288051;
  case TYPE_ENUM:
    iVar5 = MapValueRef::GetEnumValue(local_98);
LAB_002880c7:
    *local_a0 = '\x10';
    local_a0 = io::CodedOutputStream::WriteVarint32SignExtendedToArray(iVar5,local_a0 + 1);
    break;
  case TYPE_SFIXED32:
    uVar14 = MapValueRef::GetInt32Value(local_98);
LAB_0028814d:
    *local_a0 = '\x15';
    *(uint32 *)(local_a0 + 1) = uVar14;
LAB_0028815a:
    local_a0 = local_a0 + 5;
    break;
  case TYPE_SFIXED64:
    uVar15 = MapValueRef::GetInt64Value(local_98);
LAB_002880ef:
    *local_a0 = '\x11';
    *(uint64 *)(local_a0 + 1) = uVar15;
LAB_002880fe:
    local_a0 = local_a0 + 9;
    break;
  case TYPE_SINT32:
    iVar5 = MapValueRef::GetInt32Value(local_98);
    *local_a0 = '\x10';
    puVar13 = local_a0 + 1;
    uVar14 = iVar5 * 2 ^ iVar5 >> 0x1f;
LAB_00288051:
    local_a0 = io::CodedOutputStream::WriteVarint32ToArray(uVar14,puVar13);
    break;
  case MAX_TYPE:
    iVar11 = MapValueRef::GetInt64Value(local_98);
    *local_a0 = '\x10';
    uVar15 = iVar11 * 2 ^ iVar11 >> 0x3f;
    goto LAB_002880b3;
  }
  return local_a0;
}

Assistant:

static uint8* InternalSerializeMapEntry(const FieldDescriptor* field,
                                        const MapKey& key,
                                        const MapValueRef& value, uint8* target,
                                        io::EpsCopyOutputStream* stream) {
  const FieldDescriptor* key_field = field->message_type()->field(0);
  const FieldDescriptor* value_field = field->message_type()->field(1);

  size_t size = kMapEntryTagByteSize;
  size += MapKeyDataOnlyByteSize(key_field, key);
  size += MapValueRefDataOnlyByteSize(value_field, value);
  stream->EnsureSpace(&target);
  target = WireFormatLite::WriteTagToArray(
      field->number(), WireFormatLite::WIRETYPE_LENGTH_DELIMITED, target);
  target = io::CodedOutputStream::WriteVarint32ToArray(size, target);
  target = SerializeMapKeyWithCachedSizes(key_field, key, target, stream);
  target =
      SerializeMapValueRefWithCachedSizes(value_field, value, target, stream);
  return target;
}